

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O1

bool __thiscall iutest::floating_point<double>::AlmostEquals(floating_point<double> *this,_Myt *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (this->m_v).iv;
  if (((~uVar1 & 0x7ff0000000000000) != 0 || (uVar1 & 0xfffffffffffff) == 0) &&
     (uVar2 = (rhs->m_v).iv, (~uVar2 & 0x7ff0000000000000) != 0 || (uVar2 & 0xfffffffffffff) == 0))
  {
    uVar3 = uVar1 | 0x8000000000000000;
    if ((long)uVar1 < 0) {
      uVar3 = -uVar1;
    }
    uVar1 = uVar2 | 0x8000000000000000;
    if ((long)uVar2 < 0) {
      uVar1 = -uVar2;
    }
    uVar2 = uVar1 - uVar3;
    if (uVar1 < uVar3) {
      uVar2 = -(uVar1 - uVar3);
    }
    return uVar2 < 5;
  }
  return false;
}

Assistant:

bool    AlmostEquals(const _Myt& rhs) const
    {
        if( is_nan() || rhs.is_nan() )
        {
            return false;
        }
        return NanSensitiveAlmostEquals(rhs);
    }